

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGenerator::IsExcluded
          (cmGlobalGenerator *this,cmLocalGenerator *root,cmGeneratorTarget *target)

{
  cmGeneratorTarget *pcVar1;
  TargetType TVar2;
  cmLocalGenerator *gen;
  bool local_5e;
  allocator local_49;
  string local_48;
  cmGeneratorTarget *local_28;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *root_local;
  cmGlobalGenerator *this_local;
  
  local_28 = target;
  target_local = (cmGeneratorTarget *)root;
  root_local = (cmLocalGenerator *)this;
  TVar2 = cmGeneratorTarget::GetType(target);
  pcVar1 = local_28;
  local_5e = true;
  if (TVar2 != INTERFACE_LIBRARY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"EXCLUDE_FROM_ALL",&local_49);
    local_5e = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  pcVar1 = target_local;
  if (local_5e == false) {
    gen = cmGeneratorTarget::GetLocalGenerator(local_28);
    this_local._7_1_ = IsExcluded(this,(cmLocalGenerator *)pcVar1,gen);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   cmGeneratorTarget* target) const
{
  if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
      target->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    // This target is excluded from its directory.
    return true;
  }
  // This target is included in its directory.  Check whether the
  // directory is excluded.
  return this->IsExcluded(root, target->GetLocalGenerator());
}